

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O0

void __thiscall muduo::Logger::~Logger(Logger *this)

{
  undefined *puVar1;
  int iVar2;
  LogStream *this_00;
  Buffer *this_01;
  char *pcVar3;
  Logger *in_RDI;
  Buffer *buf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  Impl::finish((Impl *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  this_00 = stream(in_RDI);
  this_01 = LogStream::buffer(this_00);
  puVar1 = g_output;
  pcVar3 = detail::FixedBuffer<4000>::data(this_01);
  iVar2 = detail::FixedBuffer<4000>::length(this_01);
  (*(code *)puVar1)(pcVar3,iVar2);
  if ((in_RDI->impl_).level_ == FATAL) {
    (*(code *)g_flush)();
    abort();
  }
  Impl::~Impl((Impl *)0x145a4d);
  return;
}

Assistant:

Logger::~Logger()
{
  impl_.finish();
  const LogStream::Buffer& buf(stream().buffer());
  g_output(buf.data(), buf.length());
  if (impl_.level_ == FATAL)
  {
    g_flush();
    abort();
  }
}